

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamReaderPrivate::putStringLiteral(QXmlStreamReaderPrivate *this,QStringView s)

{
  bool bVar1;
  char16_t cVar2;
  pointer this_00;
  uint *puVar3;
  reverse_iterator<const_QChar_*> *in_RDI;
  long in_FS_OFFSET;
  const_reverse_iterator end;
  const_reverse_iterator it;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  QXmlStreamSimpleStack<unsigned_int> *this_01;
  reverse_iterator<const_QChar_*> local_20;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QXmlStreamSimpleStack<unsigned_int> *)(in_RDI + 0x19);
  QStringView::size(&local_18);
  QXmlStreamSimpleStack<unsigned_int>::reserve(this_01,(qsizetype)in_RDI);
  local_20.current = (QChar *)&DAT_aaaaaaaaaaaaaaaa;
  QStringView::rbegin((QStringView *)this_01);
  QStringView::rend((QStringView *)this_01);
  while( true ) {
    bVar1 = std::operator!=(in_RDI,(reverse_iterator<const_QChar_*> *)
                                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (!bVar1) break;
    this_00 = std::reverse_iterator<const_QChar_*>::operator->(in_RDI);
    cVar2 = QChar::unicode(this_00);
    in_stack_ffffffffffffffbc = (ushort)cVar2 | 0x1a0000;
    puVar3 = QXmlStreamSimpleStack<unsigned_int>::rawPush
                       ((QXmlStreamSimpleStack<unsigned_int> *)(in_RDI + 0x19));
    *puVar3 = in_stack_ffffffffffffffbc;
    std::reverse_iterator<const_QChar_*>::operator++(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::putStringLiteral(QStringView s)
{
    putStack.reserve(s.size());
    for (auto it = s.rbegin(), end = s.rend(); it != end; ++it)
        putStack.rawPush() = ((LETTER << 16) | it->unicode());
}